

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cpp
# Opt level: O0

void opt_Pop(void)

{
  OptStackEntry *__ptr;
  OptStackEntry *entry;
  
  __ptr = stack;
  if (stack == (OptStackEntry *)0x0) {
    error("No entries in the option stack\n");
  }
  else {
    opt_B(stack->binary);
    opt_G(__ptr->gbgfx);
    opt_P(__ptr->fillByte);
    opt_Q(__ptr->fixPrecision);
    opt_H((bool)(__ptr->warnOnHaltNop & 1));
    opt_h((bool)(__ptr->haltNop & 1));
    opt_L((bool)(__ptr->optimizeLoads & 1));
    opt_l((bool)(__ptr->warnOnLdOpt & 1));
    opt_R(__ptr->maxRecursionDepth);
    warningsAreErrors = (bool)(__ptr->warningsAreErrors & 1);
    memcpy(warningStates,__ptr->warningStates,0x58);
    stack = __ptr->next;
    free(__ptr);
  }
  return;
}

Assistant:

void opt_Pop(void)
{
	if (stack == NULL) {
		error("No entries in the option stack\n");
		return;
	}

	struct OptStackEntry *entry = stack;

	opt_B(entry->binary);
	opt_G(entry->gbgfx);
	opt_P(entry->fillByte);
	opt_Q(entry->fixPrecision);
	opt_H(entry->warnOnHaltNop);
	opt_h(entry->haltNop);
	opt_L(entry->optimizeLoads);
	opt_l(entry->warnOnLdOpt);
	opt_R(entry->maxRecursionDepth);

	// opt_W does not apply a whole warning state; it processes one flag string
	warningsAreErrors = entry->warningsAreErrors;
	memcpy(warningStates, entry->warningStates, numWarningStates);

	stack = entry->next;
	free(entry);
}